

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  Ch *pCVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong i;
  long lVar8;
  double *pdVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  byte bVar15;
  int iVar16;
  byte *pbVar17;
  byte *pbVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  pbVar3 = (byte *)is->src_;
  pCVar4 = is->head_;
  bVar2 = *pbVar3;
  pbVar17 = pbVar3;
  bVar15 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar17 = pbVar3 + 1;
    bVar15 = pbVar3[1];
  }
  if (bVar15 == 0x30) {
    uVar12 = (uint)pbVar17[1];
    pbVar17 = pbVar17 + 1;
    dVar19 = 0.0;
    bVar7 = false;
    bVar6 = false;
    iVar10 = 0;
    i = 0;
    bVar5 = false;
    uVar11 = 0;
    goto LAB_00104b52;
  }
  if ((byte)(bVar15 - 0x31) < 9) {
    uVar11 = bVar15 - 0x30;
    bVar15 = pbVar17[1];
    uVar13 = (ulong)bVar15;
    pbVar17 = pbVar17 + 1;
    dVar19 = 0.0;
    if (bVar2 == 0x2d) {
      if ((byte)(bVar15 - 0x30) < 10) {
        iVar10 = 0;
LAB_001049a9:
        if (uVar11 < 0xccccccc) {
LAB_001049b1:
          uVar11 = ((int)uVar13 + uVar11 * 10) - 0x30;
          iVar10 = iVar10 + 1;
          bVar15 = pbVar17[1];
          uVar13 = (ulong)bVar15;
          pbVar17 = pbVar17 + 1;
          if (9 < (byte)(bVar15 - 0x30)) goto LAB_00104a7e;
          goto LAB_001049a9;
        }
        if (uVar11 != 0xccccccc) goto LAB_00104a21;
        if ((byte)uVar13 < 0x39) goto LAB_001049b1;
        uVar11 = 0xccccccc;
        uVar13 = 0x39;
LAB_00104a21:
        i = (ulong)uVar11;
        if (bVar2 == 0x2d) {
          do {
            if ((0xccccccccccccccb < i) && (0x38 < (byte)uVar13 || i != 0xccccccccccccccc))
            goto LAB_00104ad6;
            i = (uVar13 & 0xf) + i * 10;
            iVar10 = iVar10 + 1;
            bVar15 = pbVar17[1];
            uVar13 = (ulong)bVar15;
            pbVar17 = pbVar17 + 1;
          } while ((byte)(bVar15 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < i) && (0x35 < (byte)uVar13 || i != 0x1999999999999999))
            goto LAB_00104ad6;
            i = (uVar13 & 0xf) + i * 10;
            iVar10 = iVar10 + 1;
            bVar15 = pbVar17[1];
            uVar13 = (ulong)bVar15;
            pbVar17 = pbVar17 + 1;
          } while ((byte)(bVar15 - 0x30) < 10);
        }
        uVar12 = (uint)bVar15;
        dVar19 = 0.0;
        bVar5 = true;
        bVar7 = false;
        bVar6 = false;
        goto LAB_00104b52;
      }
LAB_00104da7:
      iVar10 = 0;
    }
    else {
      if (9 < (byte)(bVar15 - 0x30)) goto LAB_00104da7;
      iVar10 = 0;
      do {
        if (0x19999998 < uVar11) {
          if (uVar11 != 0x19999999) goto LAB_00104a21;
          if (0x35 < (byte)uVar13) {
            uVar11 = 0x19999999;
            goto LAB_00104a21;
          }
        }
        uVar11 = ((int)uVar13 + uVar11 * 10) - 0x30;
        iVar10 = iVar10 + 1;
        bVar15 = pbVar17[1];
        uVar13 = (ulong)bVar15;
        pbVar17 = pbVar17 + 1;
      } while ((byte)(bVar15 - 0x30) < 10);
    }
LAB_00104a7e:
    uVar12 = (uint)bVar15;
    bVar6 = false;
    bVar7 = false;
    i = 0;
    bVar5 = false;
    goto LAB_00104b52;
  }
  lVar8 = (long)pbVar17 - (long)pCVar4;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_00104d9e;
LAB_00104d6c:
  do {
    pbVar18 = pbVar17 + 1;
    pbVar17 = pbVar17 + 1;
  } while ((byte)(*pbVar18 - 0x30) < 10);
LAB_00104e19:
  iVar16 = -iVar10;
  if (!bVar7) {
    iVar16 = iVar10;
  }
LAB_00104e2b:
  if (!bVar6) {
    if (bVar5) {
      if (bVar2 == 0x2d) {
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int64(handler,-i);
      }
      else {
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Uint64(handler,i);
      }
    }
    else if (bVar2 == 0x2d) {
      bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int(handler,-uVar11);
    }
    else {
      bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint(handler,uVar11);
    }
    if (bVar7 == false) {
      *(undefined4 *)(this + 0x30) = 0x10;
LAB_00104c5a:
      *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar4;
    }
    goto LAB_00104f1f;
  }
LAB_00104e30:
  uVar11 = iVar16 + iVar14;
  if ((int)uVar11 < -0x134) {
    dVar20 = 0.0;
    if (0xfffffd97 < uVar11) {
      dVar20 = (dVar19 / 1e+308) /
               *(double *)(internal::Pow10(int)::e + (ulong)(-uVar11 - 0x134) * 8);
    }
  }
  else if ((int)uVar11 < 0) {
    dVar20 = dVar19 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar11 * 8);
  }
  else {
    dVar20 = dVar19 * *(double *)(internal::Pow10(int)::e + (ulong)uVar11 * 8);
  }
  if (bVar2 == 0x2d) {
    dVar20 = -dVar20;
  }
  pdVar9 = (double *)(handler->stack_).stackTop_;
  if ((handler->stack_).stackEnd_ < pdVar9 + 2) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&handler->stack_,1);
    pdVar9 = (double *)(handler->stack_).stackTop_;
  }
  (handler->stack_).stackTop_ = (char *)(pdVar9 + 2);
  pdVar9[1] = 1.3140351748525322e-298;
  *pdVar9 = dVar20;
  goto LAB_00104f1f;
LAB_00104ad6:
  auVar21._8_4_ = (int)(i >> 0x20);
  auVar21._0_8_ = i;
  auVar21._12_4_ = 0x45300000;
  dVar19 = (auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  do {
    if (1.7976931348623158e+307 <= dVar19) {
      *(undefined4 *)(this + 0x30) = 0xd;
      goto LAB_00104c5a;
    }
    dVar19 = dVar19 * 10.0 + (double)((int)uVar13 + -0x30);
    bVar15 = pbVar17[1];
    uVar13 = (ulong)bVar15;
    uVar12 = (uint)bVar15;
    pbVar17 = pbVar17 + 1;
  } while ((byte)(bVar15 - 0x30) < 10);
  bVar7 = true;
  bVar6 = true;
  bVar5 = true;
LAB_00104b52:
  if ((char)uVar12 == '.') {
    pbVar18 = pbVar17 + 1;
    uVar12 = (uint)*pbVar18;
    pbVar17 = pbVar17 + 1;
    if (0xf5 < (byte)(*pbVar18 - 0x3a)) {
      iVar14 = 0;
      pbVar18 = pbVar17;
      if (bVar7) {
LAB_00104c07:
        do {
          pbVar17 = pbVar18;
          if (0x39 < (byte)uVar12) goto LAB_00104cb8;
          if (iVar10 < 0x11) {
            dVar19 = dVar19 * 10.0 + (double)(int)(uVar12 - 0x30);
            iVar14 = iVar14 + -1;
            if (0.0 < dVar19) {
              iVar10 = iVar10 + 1;
            }
          }
          pbVar1 = pbVar18 + 1;
          uVar12 = (uint)*pbVar1;
          pbVar17 = pbVar18 + 1;
          pbVar18 = pbVar17;
        } while ('/' < (char)*pbVar1);
        goto LAB_00104c44;
      }
      if (!bVar5) {
        i = (ulong)uVar11;
      }
      iVar14 = 0;
      do {
        if ((0x39 < (byte)uVar12) || (i >> 0x35 != 0)) {
          auVar22._8_4_ = (int)(i >> 0x20);
          auVar22._0_8_ = i;
          auVar22._12_4_ = 0x45300000;
          dVar19 = (auVar22._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
          bVar6 = true;
          goto LAB_00104c07;
        }
        pbVar17 = pbVar18 + 1;
        iVar14 = iVar14 + -1;
        i = (ulong)(uVar12 - 0x30) + i * 10;
        iVar10 = iVar10 + (uint)(i != 0);
        pbVar1 = pbVar18 + 1;
        uVar12 = (uint)*pbVar1;
        pbVar18 = pbVar17;
      } while ('/' < (char)*pbVar1);
      dVar19 = (double)(long)i;
      iVar16 = 0;
      goto LAB_00104e30;
    }
    lVar8 = (long)pbVar17 - (long)pCVar4;
    *(undefined4 *)(this + 0x30) = 0xe;
  }
  else {
    iVar14 = 0;
LAB_00104cb8:
    if ((uVar12 | 0x20) != 0x65) {
LAB_00104c44:
      iVar16 = 0;
      goto LAB_00104e2b;
    }
    uVar13 = (ulong)uVar11;
    if (bVar5) {
      uVar13 = i;
    }
    if (!bVar6) {
      auVar23._8_4_ = (int)(uVar13 >> 0x20);
      auVar23._0_8_ = uVar13;
      auVar23._12_4_ = 0x45300000;
      dVar19 = (auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
      bVar6 = true;
    }
    bVar15 = pbVar17[1];
    bVar7 = bVar15 != 0x2b;
    if ((bVar7) && (bVar15 != 0x2d)) {
      if ((byte)(bVar15 - 0x30) < 10) {
        pbVar17 = pbVar17 + 2;
        iVar10 = bVar15 - 0x30;
LAB_00104dd6:
        do {
          bVar15 = *pbVar17;
          if (9 < (byte)(bVar15 - 0x30)) {
            bVar7 = false;
            goto LAB_00104e19;
          }
          pbVar17 = pbVar17 + 1;
          iVar10 = iVar10 * 10 + (uint)bVar15 + -0x30;
        } while (iVar10 <= 0x134 - iVar14);
        *(undefined4 *)(this + 0x30) = 0xd;
        *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar4;
        goto LAB_00104f1f;
      }
      pbVar17 = pbVar17 + 1;
    }
    else {
      pbVar18 = pbVar17 + 2;
      if ((byte)(*pbVar18 - 0x30) < 10) {
        pbVar17 = pbVar17 + 3;
        iVar10 = *pbVar18 - 0x30;
        if (bVar15 != 0x2b) {
          bVar15 = *pbVar17;
          if ((byte)(bVar15 - 0x30) < 10) {
            do {
              iVar10 = iVar10 * 10 + (uint)bVar15 + -0x30;
              if (0xccccccb < iVar10) goto LAB_00104d6c;
              pbVar17 = pbVar17 + 1;
              bVar15 = *pbVar17;
            } while ((byte)(bVar15 - 0x30) < 10);
          }
          else {
            bVar7 = true;
          }
          goto LAB_00104e19;
        }
        goto LAB_00104dd6;
      }
      pbVar17 = pbVar17 + 2;
    }
    lVar8 = (long)pbVar17 - (long)pCVar4;
    *(undefined4 *)(this + 0x30) = 0xf;
  }
LAB_00104d9e:
  *(long *)(this + 0x38) = lVar8;
LAB_00104f1f:
  is->src_ = (Ch *)pbVar17;
  is->head_ = pCVar4;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            useNanOrInf = true;
            if (RAPIDJSON_LIKELY(Consume(s, 'N') && Consume(s, 'a') && Consume(s, 'N'))) {
                d = std::numeric_limits<double>::quiet_NaN();
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I') && Consume(s, 'n') && Consume(s, 'f'))) {
                d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                            && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y'))))
                    RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (RAPIDJSON_UNLIKELY(d >= 1.7976931348623157e307)) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }